

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindTexturesTest::iterate(FunctionalBindTexturesTest *this)

{
  ostringstream *this_00;
  Context *context;
  GLuint GVar1;
  GLboolean GVar2;
  int iVar3;
  GLenum GVar4;
  uint uVar5;
  undefined4 extraout_var;
  pointer pTVar6;
  TestError *this_01;
  GLint i_1;
  GLuint GVar7;
  Texture *this_02;
  GLint i;
  GLenum *pGVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  GLint i_2;
  ulong uVar12;
  GLint max_textures;
  GLuint local_23c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_texture_ids;
  Buffer buffer;
  vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> texture;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  max_textures = 0;
  (*gl->getIntegerv)(0x8b4d,&max_textures);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xab7);
  buffer.m_id = 0xffffffff;
  buffer.m_context = (Context *)0x0;
  buffer.m_target = 0x8892;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::resize
            (&texture,(long)max_textures);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_ids,(long)max_textures);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&t_texture_ids,(long)max_textures);
  MultiBind::Buffer::InitData
            (&buffer,(this->super_TestCase).m_context,0x8c2a,0x88ea,0x10,(GLvoid *)0x0);
  for (lVar9 = 0; lVar9 != 0xb0; lVar9 = lVar9 + 0x10) {
    GVar4 = *(GLenum *)((long)&s_texture_infos + lVar9);
    this_02 = (Texture *)
              ((long)&(texture.
                       super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar9);
    context = (this->super_TestCase).m_context;
    if (GVar4 == 0x8c2a) {
      MultiBind::Texture::InitBuffer(this_02,context,0x8058,buffer.m_id);
    }
    else {
      MultiBind::Texture::InitStorage(this_02,context,GVar4,1,0x8058,6,6,6,false);
    }
    MultiBind::Texture::Bind(gl,0,GVar4);
  }
  lVar10 = 0xb0;
  GVar7 = 1;
  for (lVar9 = 0xb; lVar9 < max_textures; lVar9 = lVar9 + 1) {
    MultiBind::Texture::InitStorage
              ((Texture *)
               ((long)&(texture.
                        super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar10),
               (this->super_TestCase).m_context,0xde1,1,0x8058,6,6,6,false);
    lVar10 = lVar10 + 0x10;
  }
  MultiBind::Texture::Bind(gl,0,0xde1);
  pTVar6 = texture.
           super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar9 = 0; lVar9 < max_textures; lVar9 = lVar9 + 1) {
    texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar9] = pTVar6->m_id;
    pTVar6 = pTVar6 + 1;
  }
  (*gl->bindTextures)(0,max_textures,
                      texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xaeb);
  pGVar8 = &DAT_01db8de4;
  for (uVar12 = 0; (long)uVar12 < (long)max_textures; uVar12 = uVar12 + 1) {
    GVar4 = 0x8069;
    if (uVar12 < 0xb) {
      GVar4 = *pGVar8;
    }
    checkTextureBinding((this->super_TestCase).m_context,GVar4,(GLuint)uVar12,
                        texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar12]);
    pGVar8 = pGVar8 + 4;
  }
  for (lVar9 = 0; lVar9 < max_textures; lVar9 = lVar9 + 1) {
    t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar9] = 0;
  }
  uVar5 = max_textures / 2;
  (*gl->bindTextures)(0,uVar5,t_texture_ids.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb00);
  uVar12 = 0;
  uVar11 = 0;
  if (0 < (int)uVar5) {
    uVar11 = (ulong)uVar5;
  }
  pGVar8 = &DAT_01db8de4;
  local_23c = uVar5;
  for (; GVar1 = local_23c, uVar11 != uVar12; uVar12 = uVar12 + 1) {
    GVar4 = 0x8069;
    if (uVar12 < 0xb) {
      GVar4 = *pGVar8;
    }
    checkTextureBinding((this->super_TestCase).m_context,GVar4,(GLuint)uVar12,0);
    pGVar8 = pGVar8 + 4;
  }
  uVar12 = (ulong)(int)local_23c;
  pGVar8 = &DAT_01db8de4 + uVar12 * 4;
  for (; (long)uVar12 < (long)max_textures; uVar12 = uVar12 + 1) {
    GVar4 = 0x8069;
    if (uVar12 < 0xb) {
      GVar4 = *pGVar8;
    }
    checkTextureBinding((this->super_TestCase).m_context,GVar4,(GLuint)uVar12,
                        texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar12]);
    pGVar8 = pGVar8 + 4;
  }
  (*gl->bindTextures)(GVar1,max_textures - GVar1,(GLuint *)0x0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb13);
  pGVar8 = &DAT_01db8de4;
  for (uVar12 = 0; (long)uVar12 < (long)max_textures; uVar12 = uVar12 + 1) {
    GVar4 = 0x8069;
    if (uVar12 < 0xb) {
      GVar4 = *pGVar8;
    }
    checkTextureBinding((this->super_TestCase).m_context,GVar4,(GLuint)uVar12,0);
    pGVar8 = pGVar8 + 4;
  }
  while( true ) {
    GVar2 = (*gl->isTexture)(GVar7);
    if (GVar2 != '\x01') break;
    GVar7 = GVar7 + 1;
  }
  *texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = GVar7;
  (*gl->bindTextures)(0,max_textures,
                      texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  local_1c0.m_value = (*gl->getError)();
  if (local_1c0.m_value == 0x502) {
    checkTextureBinding((this->super_TestCase).m_context,0x8068,0,0);
    pGVar8 = &DAT_01db8df4;
    for (uVar12 = 1; (long)uVar12 < (long)max_textures; uVar12 = uVar12 + 1) {
      GVar4 = 0x8069;
      if (uVar12 < 0xb) {
        GVar4 = *pGVar8;
      }
      checkTextureBinding((this->super_TestCase).m_context,GVar4,(GLuint)uVar12,
                          texture_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar12]);
      pGVar8 = pGVar8 + 4;
    }
    (*gl->bindTextures)(0,max_textures,(GLuint *)0x0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"BindTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xb3b);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::~vector
              (&texture);
    MultiBind::Buffer::~Buffer(&buffer);
    return STOP;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"File: ");
  std::operator<<((ostream *)this_00,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 );
  std::operator<<((ostream *)this_00,", line: ");
  std::ostream::operator<<(this_00,0xb31);
  std::operator<<((ostream *)this_00,". Got wrong error: ");
  local_1c0.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
  std::operator<<((ostream *)this_00,", expected: ");
  local_1d0.m_getName = glu::getErrorName;
  local_1d0.m_value = 0x502;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
  std::operator<<((ostream *)this_00,", message: ");
  std::operator<<((ostream *)this_00,"BindTextures with invalid texture id");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0xb31);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindTexturesTest::iterate()
{
	static const GLuint depth  = 6;
	static const GLuint height = 6;
	static const GLuint width  = 6;

	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLuint invalid_id   = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_textures = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &max_textures);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	Buffer				 buffer;
	std::vector<Texture> texture;
	std::vector<GLuint>  texture_ids;
	std::vector<GLuint>  t_texture_ids;

	texture.resize(max_textures);
	texture_ids.resize(max_textures);
	t_texture_ids.resize(max_textures);

	/* Prepare buffer */
	buffer.InitData(m_context, GL_TEXTURE_BUFFER, GL_DYNAMIC_COPY, 16 /* size */, 0 /* data */);

	/* Prepare textures */
	for (size_t i = 0; i < s_n_texture_tragets; ++i)
	{
		const GLenum target = s_texture_infos[i].m_target;

		if (GL_TEXTURE_BUFFER != target)
		{
			texture[i].InitStorage(m_context, target, 1, GL_RGBA8, width, height, depth);
		}
		else
		{
			texture[i].InitBuffer(m_context, GL_RGBA8, buffer.m_id);
		}

		/* Unbind */
		Texture::Bind(gl, 0, target);
	}

	for (GLint i = s_n_texture_tragets; i < max_textures; ++i)
	{
		texture[i].InitStorage(m_context, GL_TEXTURE_2D, 1, GL_RGBA8, width, height, depth);
	}

	/* Unbind */
	Texture::Bind(gl, 0, GL_TEXTURE_2D);

	for (GLint i = 0; i < max_textures; ++i)
	{
		texture_ids[i] = texture[i].m_id;
	}

	/*
	 * - execute BindTextures to bind all textures;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * set;
	 */
	gl.bindTextures(0, max_textures, &texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/*
	 * - execute BindTextures for the first half of units with <textures> filled
	 * with zeros, to unbind those units;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * unbound;
	 */
	GLint half_index = max_textures / 2;

	for (GLint i = 0; i < max_textures; ++i)
	{
		t_texture_ids[i] = 0;
	}

	gl.bindTextures(0, half_index, &t_texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < half_index; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, 0);
	}

	for (GLint i = half_index; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/*
	 * - execute BindTextures for the second half of units with NULL as<textures>,
	 * to unbind those units;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * unbound;
	 */
	gl.bindTextures(half_index, max_textures - half_index, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, 0);
	}

	/*
	 * - modify <textures> so first entry is invalid;
	 * - execute BindTextures to bind all textures; It is expected that
	 * INVALID_OPERATION will be generated;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * set;
	 */

	/* Find invalid id */
	while (1)
	{
		if (GL_TRUE != gl.isTexture(invalid_id))
		{
			break;
		}

		invalid_id += 1;
	}

	/* Set invalid id */
	texture_ids[0] = invalid_id;

	gl.bindTextures(0, max_textures, &texture_ids[0]);
	CHECK_ERROR(GL_INVALID_OPERATION, "BindTextures with invalid texture id");

	checkTextureBinding(m_context, getBinding(0), 0, 0);
	for (GLint i = 1; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/* - unbind all textures. */
	gl.bindTextures(0, max_textures, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}